

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

void compactor_deregister_file(filemgr *file)

{
  int iVar1;
  avl_node *paVar2;
  undefined8 *in_RDI;
  openfiles_elem_conflict *elem;
  openfiles_elem_conflict query;
  avl_node *a;
  char local_550 [8];
  avl_cmp_func *in_stack_fffffffffffffab8;
  avl_node *in_stack_fffffffffffffac0;
  avl_tree *in_stack_fffffffffffffac8;
  avl_node *in_stack_fffffffffffffad8;
  avl_tree *in_stack_fffffffffffffae0;
  
  strcpy(local_550,(char *)*in_RDI);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar2 = avl_search(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8)
  ;
  if (paVar2 != (avl_node *)0x0) {
    iVar1 = *(int *)&paVar2[-1].left + -1;
    *(int *)&paVar2[-1].left = iVar1;
    if (iVar1 == 0) {
      if (((ulong)paVar2[-1].left & 0x10000000000) == 0) {
        avl_remove(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        free(paVar2 + -0x36);
      }
      else {
        paVar2[-0xc].right = (avl_node *)0x0;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return;
}

Assistant:

void compactor_deregister_file(struct filemgr *file)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        if ((--elem->register_count) == 0) {
            // if no handle refers this file
            if (elem->daemon_compact_in_progress) {
                // This file is waiting for compaction by compactor (but not opened
                // yet). Do not remove 'elem' for now. The 'elem' will be automatically
                // replaced after the compaction is done by calling
                // 'compactor_switch_file()'. However, elem->file should be set to NULL
                // in order to be removed from the AVL tree in case of the compaction
                // failure.
                elem->file = NULL;
            } else {
                // remove from the tree
                avl_remove(&openfiles, &elem->avl);
                free(elem);
            }
        }
    }
    mutex_unlock(&cpt_lock);
}